

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

bool Fossilize::create_low_priority_autogroup(void)

{
  __pid_t _Var1;
  __pid_t _Var2;
  size_t sVar3;
  FILE *__stream;
  FILE *file_1;
  FILE *pFStack_20;
  char buffer [2];
  FILE *file;
  bool autogroups_enabled;
  pid_t group_pid;
  
  _Var1 = setsid();
  if (_Var1 < 0) {
    fprintf(_stderr,"Fossilize ERROR: Failed to set PGID in child.\n");
  }
  else {
    _Var2 = getpgrp();
    if (_Var1 == _Var2) {
      _Var1 = getpgrp();
      _Var2 = getpid();
      if (_Var1 == _Var2) {
        file._7_1_ = false;
        pFStack_20 = fopen("/proc/sys/kernel/sched_autogroup_enabled","rb");
        if (pFStack_20 != (FILE *)0x0) {
          memset((void *)((long)&file_1 + 6),0,2);
          sVar3 = fread((void *)((long)&file_1 + 6),1,2,pFStack_20);
          file._7_1_ = sVar3 != 0 && file_1._6_1_ == '1';
          fclose(pFStack_20);
        }
        if (file._7_1_) {
          __stream = fopen("/proc/self/autogroup","w");
          if (__stream == (FILE *)0x0) {
            fprintf(_stderr,
                    "Fossilize ERROR: /proc/self/autogroup does not exist on this system. Skipping autogrouping.\n"
                   );
          }
          else {
            fprintf(_stderr,"Fossilize INFO: Setting autogroup scheduling.\n");
            fputs("19",__stream);
            fclose(__stream);
          }
        }
        else {
          fprintf(_stderr,
                  "Fossilize INFO: Autogroup scheduling is not enabled on this kernel. Will rely entirely on nice().\n"
                 );
        }
        return true;
      }
    }
    fprintf(_stderr,"Fossilize ERROR: Failed to validate PGID in child.\n");
  }
  return false;
}

Assistant:

static bool create_low_priority_autogroup()
{
	pid_t group_pid;

	// Set the process group ID so we can kill all the child processes as needed.
	// Use a new session ID so that we get a new scheduling autogroup.
	// This will also create a new process group.
	if ((group_pid = setsid()) < 0)
	{
		LOGE("Failed to set PGID in child.\n");
		return false;
	}

	// Sanity check that setsid did what we expected.
	if (group_pid != getpgrp() || getpgrp() != getpid())
	{
		LOGE("Failed to validate PGID in child.\n");
		return false;
	}

#ifdef __linux__
	bool autogroups_enabled = false;
	{
		FILE *file = fopen("/proc/sys/kernel/sched_autogroup_enabled", "rb");
		if (file)
		{
			char buffer[2] = {};
			if (fread(buffer, 1, sizeof(buffer), file) >= 1)
				autogroups_enabled = buffer[0] == '1';
			fclose(file);
		}

		// If the kernel does not enable autogroup scheduling support, don't bother.
	}

	if (autogroups_enabled)
	{
		// There is no API for setting the autogroup scheduling, so do it here.
		// Reference: https://github.com/nlburgin/reallynice
		FILE *file = fopen("/proc/self/autogroup", "w");
		if (file)
		{
			LOGI("Setting autogroup scheduling.\n");
			fputs("19", file);
			fclose(file);
		}
		else
			LOGE("/proc/self/autogroup does not exist on this system. Skipping autogrouping.\n");
	}
	else
		LOGI("Autogroup scheduling is not enabled on this kernel. Will rely entirely on nice().\n");
#endif

	return true;
}